

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

void duckdb::ReplaceAliases
               (ParsedExpression *expr,ColumnList *list,
               unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *alias_map)

{
  ColumnRefExpression *pCVar1;
  reference column_name;
  mapped_type *pmVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_69;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  LogicalIndex idx_entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40 [24];
  
  if ((expr->super_BaseExpression).type == COLUMN_REF) {
    pCVar1 = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    column_name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(&pCVar1->column_names,0);
    idx_entry = ColumnList::GetColumnIndex(list,column_name);
    pmVar2 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)alias_map,&idx_entry.index);
    ::std::__cxx11::string::string((string *)local_68._M_pod_data,(string *)pmVar2);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_68;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_40,__l,&local_69);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pCVar1->column_names,local_40);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_40);
    ::std::__cxx11::string::~string((string *)local_68._M_pod_data);
  }
  local_50 = ::std::
             _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/table_binding.cpp:150:12)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/table_binding.cpp:150:12)>
             ::_M_manager;
  local_68._M_unused._M_object = list;
  local_68._8_8_ = alias_map;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_68);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return;
}

Assistant:

static void ReplaceAliases(ParsedExpression &expr, const ColumnList &list,
                           const unordered_map<idx_t, string> &alias_map) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &colref = expr.Cast<ColumnRefExpression>();
		D_ASSERT(!colref.IsQualified());
		auto &col_names = colref.column_names;
		D_ASSERT(col_names.size() == 1);
		auto idx_entry = list.GetColumnIndex(col_names[0]);
		auto &alias = alias_map.at(idx_entry.index);
		col_names = {alias};
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](ParsedExpression &child) { ReplaceAliases(child, list, alias_map); });
}